

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O3

TestStatus *
vkt::clipping::anon_unknown_0::ClipVolume::testLargePoints
          (TestStatus *__return_storage_ptr__,Context *context)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  int iVar2;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  const_iterator cVar3;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  DrawState drawState;
  VulkanDrawContext drawContext;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> local_2f8;
  Shader local_2e0;
  int local_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int local_2c4;
  void *local_2c0;
  void *local_2b8;
  undefined8 uStack_2b0;
  long local_2a8;
  ConstPixelBufferAccess local_298;
  VulkanProgram local_270;
  DrawCallData local_268;
  undefined1 local_260 [40];
  Vec4 local_238;
  Vec4 local_228;
  undefined1 local_218 [8];
  size_type sStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [6];
  ios_base local_1a0 [384];
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,0x80);
  local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Shader *)0x0;
  local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Shader *)0x0;
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_218 = (undefined1  [8])local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"vert","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_218);
  local_2e0.binary = *(ProgramBinary **)(cVar3._M_node + 2);
  local_2e0.stage = VK_SHADER_STAGE_VERTEX_BIT;
  if (local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_2f8,
               (iterator)
               local_2f8.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_2e0);
  }
  else {
    (local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->stage = VK_SHADER_STAGE_VERTEX_BIT;
    *(undefined4 *)
     &(local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
       _M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_2e0._4_4_;
    (local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = local_2e0.binary;
    local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_218 != (undefined1  [8])local_208) {
    operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
  }
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_218 = (undefined1  [8])local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"frag","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_218);
  local_2e0.binary = *(ProgramBinary **)(cVar3._M_node + 2);
  local_2e0.stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  if (local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_2f8,
               (iterator)
               local_2f8.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_2e0);
  }
  else {
    (local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->stage = VK_SHADER_STAGE_FRAGMENT_BIT;
    *(undefined4 *)
     &(local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
       _M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_2e0._4_4_;
    (local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = local_2e0.binary;
    local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_218 != (undefined1  [8])local_208) {
    operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
  }
  local_2b8 = (void *)0x0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  local_218 = (undefined1  [8])0xbf8ccccdbf8ccccd;
  sStack_210 = 0x3f8000003dcccccd;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])0x3f8ccccdbf8ccccd;
  sStack_210 = 0x3f8000003e4ccccd;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])0x3f8ccccd3f8ccccd;
  sStack_210 = 0x3f8000003ecccccd;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])0xbf8ccccd3f8ccccd;
  sStack_210 = 0x3f8000003f19999a;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])0xbf8ccccd00000000;
  sStack_210 = 0x3f8000003f4ccccd;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])0x3f8ccccd;
  sStack_210 = 0x3f8000003f666666;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])0x3f8ccccd00000000;
  sStack_210 = 0x3f8000003dcccccd;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])0xbf8ccccd;
  sStack_210 = 0x3f8000003e4ccccd;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_2b8,
             (Vector<float,_4> *)local_218);
  local_218 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sStack_210);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&sStack_210,
             "Drawing several large points just outside the clip volume. Expecting an empty image.",
             0x54);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_218,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sStack_210);
  std::ios_base::~ios_base(local_1a0);
  drawutil::DrawState::DrawState
            ((DrawState *)(local_260 + 0xc),VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0x10,0x10);
  local_270.shaders = &local_2f8;
  local_268.vertices =
       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_2b8;
  drawutil::VulkanDrawContext::VulkanDrawContext
            ((VulkanDrawContext *)local_218,context,(DrawState *)(local_260 + 0xc),&local_268,
             &local_270);
  drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_218);
  drawutil::VulkanDrawContext::getColorPixels(&local_298,(VulkanDrawContext *)local_218);
  local_228.m_data[0] = 0.0;
  local_228.m_data[1] = 0.0;
  local_228.m_data[2] = 0.0;
  local_228.m_data[3] = 1.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_238.m_data[2] = 0.0;
  local_238.m_data[3] = 0.0;
  local_2e0.binary =
       (ProgramBinary *)CONCAT44(local_298.m_size.m_data[1],local_298.m_size.m_data[0]);
  local_2e0.stage = local_298.m_format.order;
  local_2e0._4_4_ = local_298.m_format.type;
  local_2d0 = local_298.m_size.m_data[2];
  iStack_2cc = local_298.m_pitch.m_data[0];
  iStack_2c8 = local_298.m_pitch.m_data[1];
  local_2c4 = local_298.m_pitch.m_data[2];
  local_2c0 = local_298.m_data;
  local_260._0_4_ = R;
  local_260._4_4_ = SNORM_INT8;
  iVar2 = countPixels((anon_unknown_0 *)&local_2e0,(ConstPixelBufferAccess *)local_260,
                      (IVec2 *)(ulong)(uint)local_298.m_size.m_data[0],
                      (IVec2 *)(ulong)(uint)local_298.m_size.m_data[1],&local_228,&local_238);
  local_2e0._0_8_ = &local_2d0;
  if (iVar2 == 0x100) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_2e0._0_8_,
               (long)&(local_2e0.binary)->m_format + local_2e0._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e0,"Rendered image(s) are incorrect","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_2e0._0_8_,
               (long)&(local_2e0.binary)->m_format + local_2e0._0_8_);
  }
  if ((int *)local_2e0._0_8_ != &local_2d0) {
    operator_delete((void *)local_2e0._0_8_,CONCAT44(iStack_2cc,local_2d0) + 1);
  }
  drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_218);
  if (local_2b8 != (void *)0x0) {
    operator_delete(local_2b8,local_2a8 - (long)local_2b8);
  }
  if (local_2f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testLargePoints (Context& context)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_LARGE_POINTS);

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	std::vector<Vec4> vertices;
	{
		const float delta	= 0.1f;  // much smaller than the point size
		const float p		= 1.0f + delta;

		vertices.push_back(Vec4(  -p,   -p, 0.1f, 1.0f));
		vertices.push_back(Vec4(  -p,    p, 0.2f, 1.0f));
		vertices.push_back(Vec4(   p,    p, 0.4f, 1.0f));
		vertices.push_back(Vec4(   p,   -p, 0.6f, 1.0f));
		vertices.push_back(Vec4(0.0f,   -p, 0.8f, 1.0f));
		vertices.push_back(Vec4(   p, 0.0f, 0.9f, 1.0f));
		vertices.push_back(Vec4(0.0f,    p, 0.1f, 1.0f));
		vertices.push_back(Vec4(  -p, 0.0f, 0.2f, 1.0f));
	}

	tcu::TestLog&	log	= context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Drawing several large points just outside the clip volume. Expecting an empty image." << tcu::TestLog::EndMessage;

	DrawState			drawState		(VK_PRIMITIVE_TOPOLOGY_POINT_LIST, RENDER_SIZE, RENDER_SIZE);
	DrawCallData		drawCallData	(vertices);
	VulkanProgram		vulkanProgram	(shaders);

	VulkanDrawContext	drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	// All pixels must be black -- nothing is drawn.
	const int numBlackPixels = countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());

	return (numBlackPixels == NUM_RENDER_PIXELS ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}